

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O0

void __thiscall
Rml::ConvolutionFilter::Run
          (ConvolutionFilter *this,byte *destination,Vector2i destination_dimensions,
          int destination_stride,ColorFormat destination_color_format,byte *source,
          Vector2i source_dimensions,Vector2i source_offset,ColorFormat source_color_format)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  type pfVar6;
  float fVar7;
  int destination_index;
  float pixel_opacity;
  int source_index;
  int source_x;
  int kernel_x;
  int source_y;
  int kernel_y;
  float opacity;
  int x;
  int y;
  Vector2<int> local_50;
  Vector2<int> local_48;
  Vector2i kernel_radius;
  int source_alpha_offset;
  int source_bytes_per_pixel;
  int destination_alpha_offset;
  int destination_bytes_per_pixel;
  byte *source_local;
  ColorFormat destination_color_format_local;
  int destination_stride_local;
  byte *destination_local;
  ConvolutionFilter *this_local;
  Vector2i destination_dimensions_local;
  
  iVar2 = 1;
  if (destination_color_format == RGBA8) {
    iVar2 = 4;
  }
  iVar3 = 0;
  if (destination_color_format == RGBA8) {
    iVar3 = 3;
  }
  kernel_radius.y = 1;
  if (source_color_format == RGBA8) {
    kernel_radius.y = 4;
  }
  kernel_radius.x = 0;
  if (source_color_format == RGBA8) {
    kernel_radius.x = 3;
  }
  Vector2<int>::Vector2((Vector2<int> *)&x,1);
  local_50 = Vector2<int>::operator-(&this->kernel_size,_x);
  local_48 = Vector2<int>::operator/(&local_50,2);
  for (opacity = 0.0; this_local._4_4_ = destination_dimensions.y, (int)opacity < this_local._4_4_;
      opacity = (float)((int)opacity + 1)) {
    for (kernel_y = 0; this_local._0_4_ = destination_dimensions.x, kernel_y < (int)this_local;
        kernel_y = kernel_y + 1) {
      source_y = 0;
      for (kernel_x = 0; kernel_x < (this->kernel_size).y; kernel_x = kernel_x + 1) {
        iVar4 = (((int)opacity - source_offset.y) - local_48.y) + kernel_x;
        for (source_index = 0; source_index < (this->kernel_size).x; source_index = source_index + 1
            ) {
          iVar5 = ((kernel_y - source_offset.x) - local_48.x) + source_index;
          if ((((-1 < iVar4) && (iVar4 < source_dimensions.y)) && (-1 < iVar5)) &&
             (iVar5 < source_dimensions.x)) {
            bVar1 = source[(iVar4 * source_dimensions.x + iVar5) * kernel_radius.y + kernel_radius.x
                          ];
            pfVar6 = ::std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                               (&this->kernel,
                                (long)(kernel_x * (this->kernel_size).x + source_index));
            if (this->operation == Sum) {
              source_y = (int)((float)bVar1 * *pfVar6 + (float)source_y);
            }
            else if (this->operation == Dilation) {
              source_y = (int)Math::Max<float>((float)source_y,(float)bVar1 * *pfVar6);
            }
          }
        }
      }
      fVar7 = Math::Min<float>(255.0,(float)source_y);
      destination[(int)opacity * destination_stride + kernel_y * iVar2 + iVar3] = (byte)(int)fVar7;
    }
  }
  return;
}

Assistant:

void ConvolutionFilter::Run(byte* destination, const Vector2i destination_dimensions, const int destination_stride,
	const ColorFormat destination_color_format, const byte* source, const Vector2i source_dimensions, const Vector2i source_offset,
	const ColorFormat source_color_format) const
{
	RMLUI_ZoneScopedNC("ConvFilter::Run", 0xd6bf49);

	const int destination_bytes_per_pixel = (destination_color_format == ColorFormat::RGBA8 ? 4 : 1);
	const int destination_alpha_offset = (destination_color_format == ColorFormat::RGBA8 ? 3 : 0);
	const int source_bytes_per_pixel = (source_color_format == ColorFormat::RGBA8 ? 4 : 1);
	const int source_alpha_offset = (source_color_format == ColorFormat::RGBA8 ? 3 : 0);

	const Vector2i kernel_radius = (kernel_size - Vector2i(1)) / 2;

	for (int y = 0; y < destination_dimensions.y; ++y)
	{
		for (int x = 0; x < destination_dimensions.x; ++x)
		{
			float opacity = 0.f;

			for (int kernel_y = 0; kernel_y < kernel_size.y; ++kernel_y)
			{
				const int source_y = y - source_offset.y - kernel_radius.y + kernel_y;

				for (int kernel_x = 0; kernel_x < kernel_size.x; ++kernel_x)
				{
					const int source_x = x - source_offset.x - kernel_radius.x + kernel_x;
					if (source_y >= 0 && source_y < source_dimensions.y && source_x >= 0 && source_x < source_dimensions.x)
					{
						const int source_index = (source_y * source_dimensions.x + source_x) * source_bytes_per_pixel + source_alpha_offset;
						const float pixel_opacity = float(source[source_index]) * kernel[kernel_y * kernel_size.x + kernel_x];

						switch (operation)
						{
						case FilterOperation::Sum: opacity += pixel_opacity; break;
						case FilterOperation::Dilation: opacity = Math::Max(opacity, pixel_opacity); break;
						}
					}
				}
			}

			opacity = Math::Min(255.f, opacity);

			const int destination_index = y * destination_stride + x * destination_bytes_per_pixel + destination_alpha_offset;
			destination[destination_index] = byte(opacity);
		}
	}
}